

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBB
          (DG2Dot<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *BB,int indent)

{
  LLVMNode *this_00;
  bool bVar1;
  ostream *poVar2;
  KeyT *ppVVar3;
  ostream *poVar4;
  reference ppLVar5;
  Value *pVVar6;
  int in_EDX;
  BBlock<dg::LLVMNode> *in_RSI;
  undefined8 *in_RDI;
  LLVMNode *n;
  const_iterator __end0;
  const_iterator __begin0;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range3;
  uint64_t slice_id;
  uint dfsorder;
  Indent Ind;
  ostream *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  _Self local_40;
  _Self local_38;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_30;
  ulong local_28;
  uint local_1c;
  Indent local_18 [2];
  BBlock<dg::LLVMNode> *local_10;
  
  local_10 = in_RSI;
  Indent::Indent(local_18,in_EDX);
  poVar2 = operator<<(in_stack_ffffffffffffffa0,(Indent *)in_stack_ffffffffffffff98);
  std::operator<<(poVar2,"/* Basic Block ");
  poVar2 = (ostream *)(in_RDI + 0x1a);
  ppVVar3 = BBlock<dg::LLVMNode>::getKey(local_10);
  (**(code **)*in_RDI)(in_RDI,poVar2,*ppVVar3);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0x1a)," [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  std::operator<<(poVar4,"] */\n");
  poVar4 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
  poVar4 = std::operator<<(poVar4,"subgraph cluster_bb_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  std::operator<<(poVar4," {\n");
  poVar4 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
  std::operator<<(poVar4,"\tstyle=filled fillcolor=white\n");
  poVar4 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
  std::operator<<(poVar4,"\tlabel=\"");
  ppVVar3 = BBlock<dg::LLVMNode>::getKey(local_10);
  (**(code **)*in_RDI)(in_RDI,in_RDI + 0x1a,*ppVVar3);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0x1a)," [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  std::operator<<(poVar4,"]");
  local_1c = BBlock<dg::LLVMNode>::getDFSOrder(local_10);
  if (local_1c != 0) {
    poVar4 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
    poVar4 = std::operator<<(poVar4,"\\ndfs order: ");
    std::ostream::operator<<(poVar4,local_1c);
  }
  local_28 = BBlock<dg::LLVMNode>::getSlice(local_10);
  if (local_28 != 0) {
    poVar4 = std::operator<<((ostream *)(in_RDI + 0x1a),"\\nslice: ");
    std::ostream::operator<<(poVar4,local_28);
  }
  std::operator<<((ostream *)(in_RDI + 0x1a),"\"\n");
  local_30 = BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(local_10);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                 ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)in_stack_ffffffffffffff98
                 );
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                 ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)in_stack_ffffffffffffff98
                 );
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppLVar5 = std::_List_const_iterator<dg::LLVMNode_*>::operator*
                        ((_List_const_iterator<dg::LLVMNode_*> *)0x1b99d3);
    this_00 = *ppLVar5;
    poVar4 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
    poVar4 = std::operator<<(poVar4,"\tNODE");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this_00);
    in_stack_ffffffffffffff98 = std::operator<<(poVar4," [shape=rect label=\"");
    pVVar6 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey
                       (&this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff98,pVVar6);
    std::operator<<(poVar4,"\"]\n");
    std::_List_const_iterator<dg::LLVMNode_*>::operator++(&local_38);
  }
  poVar2 = operator<<(poVar2,(Indent *)in_stack_ffffffffffffff98);
  poVar2 = std::operator<<(poVar2,"} /* cluster_bb_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  std::operator<<(poVar2," */\n\n");
  return;
}

Assistant:

void dumpBB(const BBlock<NodeT> *BB, int indent) {
        Indent Ind(indent);

        out << Ind << "/* Basic Block ";
        printKey(out, BB->getKey());
        out << " [" << BB << "] */\n";
        out << Ind << "subgraph cluster_bb_" << BB << " {\n";
        out << Ind << "\tstyle=filled fillcolor=white\n";
        out << Ind << "\tlabel=\"";

        printKey(out, BB->getKey());
        out << " [" << BB << "]";

        unsigned int dfsorder = BB->getDFSOrder();
        if (dfsorder != 0)
            out << Ind << "\\ndfs order: " << dfsorder;

        uint64_t slice_id = BB->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        for (NodeT *n : BB->getNodes()) {
            // print nodes in BB, edges will be printed later
            out << Ind << "\tNODE" << n << " [shape=rect label=\""
                << n->getKey() << "\"]\n";
        }

        out << Ind << "} /* cluster_bb_" << BB << " */\n\n";
    }